

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathStringLengthFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  xmlChar *utf;
  xmlXPathObjectPtr value;
  xmlChar *content;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (nargs == 0) {
    if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
      if (ctxt->context->node == (xmlNodePtr)0x0) {
        pxVar2 = xmlXPathCacheNewFloat(ctxt,0.0);
        xmlXPathValuePush(ctxt,pxVar2);
      }
      else {
        utf = xmlXPathCastNodeToString(ctxt->context->node);
        if (utf == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        iVar1 = xmlUTF8Strlen(utf);
        pxVar2 = xmlXPathCacheNewFloat(ctxt,(double)iVar1);
        xmlXPathValuePush(ctxt,pxVar2);
        (*xmlFree)(utf);
      }
    }
  }
  else if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING)) {
          xmlXPathErr(ctxt,0xb);
        }
        else {
          pxVar2 = xmlXPathValuePop(ctxt);
          iVar1 = xmlUTF8Strlen(pxVar2->stringval);
          value = xmlXPathCacheNewFloat(ctxt,(double)iVar1);
          xmlXPathValuePush(ctxt,value);
          xmlXPathReleaseObject(ctxt->context,pxVar2);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathStringLengthFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
        if ((ctxt == NULL) || (ctxt->context == NULL))
	    return;
	if (ctxt->context->node == NULL) {
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, 0));
	} else {
	    xmlChar *content;

	    content = xmlXPathCastNodeToString(ctxt->context->node);
            if (content == NULL)
                xmlXPathPErrMemory(ctxt);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
		xmlUTF8Strlen(content)));
	    xmlFree(content);
	}
	return;
    }
    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    cur = xmlXPathValuePop(ctxt);
    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
	xmlUTF8Strlen(cur->stringval)));
    xmlXPathReleaseObject(ctxt->context, cur);
}